

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::
write_padded<fmt::v6::internal::arg_formatter_base<fmt::v6::buffer_range<wchar_t>,fmt::v6::internal::error_handler>::char_writer>
          (basic_writer<fmt::v6::buffer_range<wchar_t>> *this,format_specs *specs,char_writer *f)

{
  uint uVar1;
  wchar_t wVar2;
  undefined8 *puVar3;
  long lVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  wchar_t __tmp;
  ulong uVar8;
  size_t size;
  char_type *pcVar9;
  byte bVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  buffer<wchar_t> *c;
  int iVar18;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  int iVar25;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  
  uVar1 = specs->width;
  uVar8 = (ulong)uVar1;
  puVar3 = *(undefined8 **)this;
  lVar12 = puVar3[2];
  if (uVar8 < 2) {
    uVar8 = lVar12 + 1;
    if ((ulong)puVar3[3] < uVar8) {
      (**(code **)*puVar3)(puVar3,uVar8);
    }
    puVar3[2] = uVar8;
    pcVar9 = (char_type *)(lVar12 * 4 + puVar3[1]);
  }
  else {
    uVar14 = lVar12 + uVar8;
    if ((ulong)puVar3[3] < uVar14) {
      (**(code **)*puVar3)(puVar3,uVar14);
    }
    puVar3[2] = uVar14;
    auVar7 = _DAT_0019c980;
    auVar6 = _DAT_00199d70;
    auVar5 = _DAT_00197040;
    lVar4 = puVar3[1];
    pcVar9 = (char_type *)(lVar4 + lVar12 * 4);
    wVar2 = (specs->fill).data_[0];
    uVar14 = uVar8 - 1;
    bVar10 = specs->field_0x9 & 0xf;
    if (bVar10 == 3) {
      uVar11 = uVar14 >> 1;
      if (uVar1 != 2) {
        pcVar9 = pcVar9 + uVar11;
        uVar13 = uVar11 + 0x3fffffffffffffff & 0x3fffffffffffffff;
        auVar23._8_4_ = (int)uVar13;
        auVar23._0_8_ = uVar13;
        auVar23._12_4_ = (int)(uVar13 >> 0x20);
        lVar4 = lVar4 + lVar12 * 4;
        lVar12 = 0;
        auVar23 = auVar23 ^ _DAT_00197040;
        do {
          auVar20._8_4_ = (int)lVar12;
          auVar20._0_8_ = lVar12;
          auVar20._12_4_ = (int)((ulong)lVar12 >> 0x20);
          auVar24 = (auVar20 | auVar6) ^ auVar5;
          iVar18 = auVar23._4_4_;
          if ((bool)(~(auVar24._4_4_ == iVar18 && auVar23._0_4_ < auVar24._0_4_ ||
                      iVar18 < auVar24._4_4_) & 1)) {
            *(wchar_t *)(lVar4 + lVar12 * 4) = wVar2;
          }
          if ((auVar24._12_4_ != auVar23._12_4_ || auVar24._8_4_ <= auVar23._8_4_) &&
              auVar24._12_4_ <= auVar23._12_4_) {
            *(wchar_t *)(lVar4 + 4 + lVar12 * 4) = wVar2;
          }
          auVar20 = (auVar20 | auVar7) ^ auVar5;
          iVar25 = auVar20._4_4_;
          if (iVar25 <= iVar18 && (iVar25 != iVar18 || auVar20._0_4_ <= auVar23._0_4_)) {
            *(wchar_t *)(lVar4 + 8 + lVar12 * 4) = wVar2;
            *(wchar_t *)(lVar4 + 0xc + lVar12 * 4) = wVar2;
          }
          lVar12 = lVar12 + 4;
        } while ((uVar13 - ((uint)(uVar11 + 0x3fffffffffffffff) & 3)) + 4 != lVar12);
      }
      *pcVar9 = f->value;
      auVar7 = _DAT_0019c980;
      auVar6 = _DAT_00199d70;
      auVar5 = _DAT_00197040;
      if (uVar14 == 0) {
        return;
      }
      uVar14 = (uVar8 * 4 + uVar11 * -4) - 8;
      auVar24._8_4_ = (int)uVar14;
      auVar24._0_8_ = uVar14;
      auVar24._12_4_ = (int)(uVar14 >> 0x20);
      auVar16._0_8_ = uVar14 >> 2;
      auVar16._8_8_ = auVar24._8_8_ >> 2;
      uVar8 = 0;
      auVar16 = auVar16 ^ _DAT_00197040;
      do {
        auVar21._8_4_ = (int)uVar8;
        auVar21._0_8_ = uVar8;
        auVar21._12_4_ = (int)(uVar8 >> 0x20);
        auVar23 = (auVar21 | auVar6) ^ auVar5;
        iVar18 = auVar16._4_4_;
        if ((bool)(~(auVar23._4_4_ == iVar18 && auVar16._0_4_ < auVar23._0_4_ ||
                    iVar18 < auVar23._4_4_) & 1)) {
          pcVar9[uVar8 + 1] = wVar2;
        }
        if ((auVar23._12_4_ != auVar16._12_4_ || auVar23._8_4_ <= auVar16._8_4_) &&
            auVar23._12_4_ <= auVar16._12_4_) {
          pcVar9[uVar8 + 2] = wVar2;
        }
        auVar23 = (auVar21 | auVar7) ^ auVar5;
        iVar25 = auVar23._4_4_;
        if (iVar25 <= iVar18 && (iVar25 != iVar18 || auVar23._0_4_ <= auVar16._0_4_)) {
          pcVar9[uVar8 + 3] = wVar2;
          pcVar9[uVar8 + 4] = wVar2;
        }
        uVar8 = uVar8 + 4;
      } while (((uVar14 >> 2) + 4 & 0xfffffffffffffffc) != uVar8);
      return;
    }
    if (bVar10 != 2) {
      pcVar9 = (char_type *)(lVar4 + lVar12 * 4);
      *pcVar9 = f->value;
      auVar7 = _DAT_0019c980;
      auVar6 = _DAT_00199d70;
      auVar5 = _DAT_00197040;
      uVar14 = uVar8 + 0x3ffffffffffffffe & 0x3fffffffffffffff;
      auVar17._8_4_ = (int)uVar14;
      auVar17._0_8_ = uVar14;
      auVar17._12_4_ = (int)(uVar14 >> 0x20);
      lVar12 = 0;
      auVar17 = auVar17 ^ _DAT_00197040;
      do {
        auVar22._8_4_ = (int)lVar12;
        auVar22._0_8_ = lVar12;
        auVar22._12_4_ = (int)((ulong)lVar12 >> 0x20);
        auVar23 = (auVar22 | auVar6) ^ auVar5;
        iVar18 = auVar17._4_4_;
        if ((bool)(~(auVar23._4_4_ == iVar18 && auVar17._0_4_ < auVar23._0_4_ ||
                    iVar18 < auVar23._4_4_) & 1)) {
          pcVar9[lVar12 + 1] = wVar2;
        }
        if ((auVar23._12_4_ != auVar17._12_4_ || auVar23._8_4_ <= auVar17._8_4_) &&
            auVar23._12_4_ <= auVar17._12_4_) {
          pcVar9[lVar12 + 2] = wVar2;
        }
        auVar23 = (auVar22 | auVar7) ^ auVar5;
        iVar25 = auVar23._4_4_;
        if (iVar25 <= iVar18 && (iVar25 != iVar18 || auVar23._0_4_ <= auVar17._0_4_)) {
          pcVar9[lVar12 + 3] = wVar2;
          pcVar9[lVar12 + 4] = wVar2;
        }
        lVar12 = lVar12 + 4;
      } while ((uVar14 - ((uint)(uVar8 + 0x3ffffffffffffffe) & 3)) + 4 != lVar12);
      return;
    }
    pcVar9 = pcVar9 + uVar14;
    uVar14 = uVar8 + 0x3ffffffffffffffe & 0x3fffffffffffffff;
    auVar15._8_4_ = (int)uVar14;
    auVar15._0_8_ = uVar14;
    auVar15._12_4_ = (int)(uVar14 >> 0x20);
    lVar4 = lVar4 + lVar12 * 4;
    lVar12 = 0;
    auVar15 = auVar15 ^ _DAT_00197040;
    do {
      auVar19._8_4_ = (int)lVar12;
      auVar19._0_8_ = lVar12;
      auVar19._12_4_ = (int)((ulong)lVar12 >> 0x20);
      auVar23 = (auVar19 | auVar6) ^ auVar5;
      iVar18 = auVar15._4_4_;
      if ((bool)(~(auVar23._4_4_ == iVar18 && auVar15._0_4_ < auVar23._0_4_ ||
                  iVar18 < auVar23._4_4_) & 1)) {
        *(wchar_t *)(lVar4 + lVar12 * 4) = wVar2;
      }
      if ((auVar23._12_4_ != auVar15._12_4_ || auVar23._8_4_ <= auVar15._8_4_) &&
          auVar23._12_4_ <= auVar15._12_4_) {
        *(wchar_t *)(lVar4 + 4 + lVar12 * 4) = wVar2;
      }
      auVar23 = (auVar19 | auVar7) ^ auVar5;
      iVar25 = auVar23._4_4_;
      if (iVar25 <= iVar18 && (iVar25 != iVar18 || auVar23._0_4_ <= auVar15._0_4_)) {
        *(wchar_t *)(lVar4 + 8 + lVar12 * 4) = wVar2;
        *(wchar_t *)(lVar4 + 0xc + lVar12 * 4) = wVar2;
      }
      lVar12 = lVar12 + 4;
    } while ((uVar14 - ((uint)(uVar8 + 0x3ffffffffffffffe) & 3)) + 4 != lVar12);
  }
  *pcVar9 = f->value;
  return;
}

Assistant:

void write_padded(const format_specs& specs, F&& f) {
    // User-perceived width (in code points).
    unsigned width = to_unsigned(specs.width);
    size_t size = f.size();  // The number of code units.
    size_t num_code_points = width != 0 ? f.width() : size;
    if (width <= num_code_points) return f(reserve(size));
    auto&& it = reserve(width + (size - num_code_points));
    char_type fill = specs.fill[0];
    std::size_t padding = width - num_code_points;
    if (specs.align == align::right) {
      it = std::fill_n(it, padding, fill);
      f(it);
    } else if (specs.align == align::center) {
      std::size_t left_padding = padding / 2;
      it = std::fill_n(it, left_padding, fill);
      f(it);
      it = std::fill_n(it, padding - left_padding, fill);
    } else {
      f(it);
      it = std::fill_n(it, padding, fill);
    }
  }